

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O2

string * __thiscall Complex::getName_abi_cxx11_(string *__return_storage_ptr__,Complex *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string Complex::getName() const
{
	return name;
}